

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<short,duckdb::DecimalParquetValueConversion<short,false>,true,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  short sVar1;
  ColumnReader *reader;
  ulong row_idx_00;
  idx_t iVar2;
  long in_RCX;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  ColumnReader *in_RDI;
  ulong in_R8;
  ByteBuffer *in_R9;
  idx_t row_idx;
  ValidityMask *result_mask;
  short *result_ptr;
  ulong local_48;
  
  reader = (ColumnReader *)FlatVector::GetData<short>((Vector *)0x861f76);
  FlatVector::Validity((Vector *)0x861f85);
  for (local_48 = in_R8; local_48 < in_R8 + in_RCX; local_48 = local_48 + 1) {
    row_idx_00 = (ulong)*(byte *)(CONCAT62(in_register_00000012,in_DX) + local_48);
    iVar2 = MaxDefine(in_RDI);
    if (row_idx_00 == iVar2) {
      sVar1 = DecimalParquetValueConversion<short,_false>::PlainRead<false>(in_R9,reader);
      *(short *)((long)&reader->_vptr_ColumnReader + local_48 * 2) = sVar1;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)in_RDI,row_idx_00);
    }
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}